

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Matrix * MatrixTranspose(Matrix mat)

{
  Matrix *in_RDI;
  
  in_RDI->m0 = mat.m0;
  in_RDI->m1 = mat.m4;
  in_RDI->m2 = mat.m8;
  in_RDI->m3 = mat.m12;
  in_RDI->m4 = mat.m1;
  in_RDI->m5 = mat.m5;
  in_RDI->m6 = mat.m9;
  in_RDI->m7 = mat.m13;
  in_RDI->m8 = mat.m2;
  in_RDI->m9 = mat.m6;
  in_RDI->m10 = mat.m10;
  in_RDI->m11 = mat.m14;
  in_RDI->m12 = mat.m3;
  in_RDI->m13 = mat.m7;
  in_RDI->m14 = mat.m11;
  in_RDI->m15 = mat.m15;
  return in_RDI;
}

Assistant:

RMAPI Matrix MatrixTranspose(Matrix mat)
{
    Matrix result = { 0 };

    result.m0 = mat.m0;
    result.m1 = mat.m4;
    result.m2 = mat.m8;
    result.m3 = mat.m12;
    result.m4 = mat.m1;
    result.m5 = mat.m5;
    result.m6 = mat.m9;
    result.m7 = mat.m13;
    result.m8 = mat.m2;
    result.m9 = mat.m6;
    result.m10 = mat.m10;
    result.m11 = mat.m14;
    result.m12 = mat.m3;
    result.m13 = mat.m7;
    result.m14 = mat.m11;
    result.m15 = mat.m15;

    return result;
}